

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

void Au_ManReorderModels(Au_Man_t *p,Au_Ntk_t *pRoot)

{
  ulong uVar1;
  long lVar2;
  void **ppvVar3;
  void *pvVar4;
  long lVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  uint *__ptr;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong *puVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  
  iVar9 = (p->vNtks).nSize;
  lVar19 = (long)iVar9;
  if (1 < lVar19) {
    lVar5 = 1;
    do {
      if (lVar19 == lVar5) goto LAB_0085a41b;
      *(undefined4 *)((long)(p->vNtks).pArray[lVar5] + 200) = 0;
      lVar5 = lVar5 + 1;
    } while (lVar19 != lVar5);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar12 = iVar9;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar12;
  if (iVar12 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar12 << 2);
  }
  p_00->pArray = piVar6;
  Vec_IntPush(p_00,0);
  Au_ManReorderModels_rec(pRoot,p_00);
  iVar9 = p_00->nSize;
  if ((long)iVar9 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  iVar12 = p_00->pArray[(long)iVar9 + -1];
  if (iVar12 != pRoot->Id) {
    __assert_fail("Vec_IntEntryLast(vOrder) == pRoot->Id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,0x1b7,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
  }
  p_00->nSize = iVar9 + -1;
  iVar9 = (p->vNtks).nSize;
  if (1 < iVar9) {
    lVar19 = 1;
    do {
      lVar5 = (long)iVar9;
      if (lVar5 <= lVar19) goto LAB_0085a41b;
      pvVar7 = (p->vNtks).pArray[lVar19];
      if (*(int *)((long)pvVar7 + 200) == 0) {
        Vec_IntPush(p_00,*(int *)((long)pvVar7 + 0x10));
        iVar9 = (p->vNtks).nSize;
        lVar5 = (long)iVar9;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < lVar5);
    iVar12 = pRoot->Id;
  }
  Vec_IntPush(p_00,iVar12);
  uVar15 = p_00->nSize;
  uVar20 = (ulong)uVar15;
  if (uVar15 != (p->vNtks).nSize) {
    __assert_fail("Vec_IntSize(vOrder) == Au_ManNtkNum(p)+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,0x1be,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
  }
  uVar18 = uVar15 - 1;
  piVar6 = p_00->pArray;
  uVar11 = uVar15;
  if (2 < (int)uVar15) {
    iVar9 = uVar15 - 2;
    uVar10 = 0;
    do {
      iVar12 = piVar6[uVar10 + 1];
      piVar6[uVar10 + 1] = piVar6[(long)iVar9 + 1];
      piVar6[(long)iVar9 + 1] = iVar12;
      uVar10 = uVar10 + 1;
      iVar9 = iVar9 + -1;
    } while (uVar18 >> 1 != uVar10);
    uVar11 = (p->vNtks).nSize;
    uVar18 = uVar11 - 1;
  }
  p_00->pArray = piVar6;
  __ptr = (uint *)malloc(0x10);
  uVar10 = 8;
  if (6 < uVar18) {
    uVar10 = (ulong)uVar11;
  }
  __ptr[1] = 0;
  if ((int)uVar10 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)(int)uVar10 << 3);
  }
  *(void **)(__ptr + 2) = pvVar7;
  if (0 < (int)uVar15) {
    uVar13 = 0;
    do {
      iVar9 = p_00->pArray[uVar13];
      if (((long)iVar9 < 0) || ((p->vNtks).nSize <= iVar9)) goto LAB_0085a41b;
      pvVar7 = (p->vNtks).pArray[iVar9];
      iVar9 = (int)uVar10;
      if ((int)uVar13 == iVar9) {
        if (iVar9 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar8 = malloc(0x80);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar8;
          *__ptr = 0x10;
          uVar10 = 0x10;
        }
        else {
          uVar10 = (ulong)(uint)(iVar9 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar8 = malloc(uVar10 * 8);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr + 2),uVar10 * 8);
          }
          *(void **)(__ptr + 2) = pvVar8;
          *__ptr = iVar9 * 2;
        }
      }
      else {
        pvVar8 = *(void **)(__ptr + 2);
      }
      uVar1 = uVar13 + 1;
      __ptr[1] = (uint)uVar1;
      *(void **)((long)pvVar8 + uVar13 * 8) = pvVar7;
      uVar13 = uVar1;
    } while (uVar20 != uVar1);
    if (uVar15 != 1) {
      piVar6 = p_00->pArray;
      if (piVar6[1] != pRoot->Id) {
        __assert_fail("Vec_IntEntry(vOrder, 1) == pRoot->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                      ,0x1ca,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
      }
      iVar9 = *piVar6;
      uVar10 = 1;
      do {
        iVar12 = piVar6[uVar10];
        if (piVar6[uVar10] < iVar9) {
          iVar12 = iVar9;
        }
        iVar9 = iVar12;
        uVar10 = uVar10 + 1;
      } while (uVar20 != uVar10);
      if (iVar9 < 0) {
        pvVar7 = (void *)0x0;
      }
      else {
        pvVar7 = calloc(1,(ulong)(iVar9 + 1U) << 2);
        if (pvVar7 == (void *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
      }
      uVar10 = 0;
      do {
        uVar15 = piVar6[uVar10];
        if ((ulong)uVar15 != 0) {
          if (((int)uVar15 < 0) || (iVar9 < (int)uVar15)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(int *)((long)pvVar7 + (ulong)uVar15 * 4) = (int)uVar10;
        }
        uVar10 = uVar10 + 1;
      } while (uVar20 != uVar10);
      free(piVar6);
      free(p_00);
      if (0 < iVar9) {
        if (*(int *)((long)pvVar7 + 4) != pRoot->Id) {
          __assert_fail("Vec_IntEntry(vOrder, 1) == pRoot->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                        ,0x1cd,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
        }
        uVar15 = (p->vNtks).nSize;
        if (1 < (int)uVar15) {
          lVar19 = 1;
          do {
            lVar5 = (long)(int)uVar15;
            if (lVar5 <= lVar19) goto LAB_0085a41b;
            pvVar8 = (p->vNtks).pArray[lVar19];
            if (iVar9 + 1U <= *(uint *)((long)pvVar8 + 0x10)) goto LAB_0085a3fc;
            *(undefined4 *)((long)pvVar8 + 0x10) =
                 *(undefined4 *)((long)pvVar7 + (ulong)*(uint *)((long)pvVar8 + 0x10) * 4);
            iVar12 = *(int *)((long)pvVar8 + 0x3c);
            if (0 < iVar12) {
              lVar5 = 0;
              do {
                lVar16 = (long)iVar12;
                if (lVar16 <= lVar5) goto LAB_0085a3fc;
                uVar15 = *(uint *)(*(long *)((long)pvVar8 + 0x40) + lVar5 * 4);
                lVar2 = *(long *)(*(long *)((long)pvVar8 + 0x78) + (long)((int)uVar15 >> 0xc) * 8);
                uVar10 = (ulong)((uVar15 & 0xfff) << 4);
                uVar20 = *(ulong *)(lVar2 + uVar10);
                if ((uVar20 & 0x700000000) == 0x600000000) {
                  if (iVar9 < (int)((uint)uVar20 & 0x3fffffff)) goto LAB_0085a3fc;
                  puVar17 = (ulong *)(lVar2 + uVar10);
                  uVar10 = (ulong)(*(uint *)((long)pvVar7 + (ulong)((uint)uVar20 * 4)) & 0x3fffffff)
                  ;
                  uVar20 = uVar20 & 0xfffffffec0000000 | uVar10;
                  *puVar17 = uVar20;
                  if (uVar10 == 0) {
                    __assert_fail("pBox->Func > 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                                  ,0x1d5,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
                  }
                  iVar12 = 0;
                  while (iVar12 < *(int *)((long)puVar17 + (uVar20 >> 0x23) * 4 + 8)) {
                    iVar14 = (uint)(uVar20 >> 0x23) + iVar12;
                    iVar12 = iVar12 + 1;
                    uVar15 = *(uint *)((long)puVar17 + (ulong)(iVar14 + 1) * 4 + 8);
                    lVar16 = *(long *)(*(long *)(*(long *)((long)puVar17 -
                                                          (ulong)((uint)puVar17 & 0x3ff)) + 0x78) +
                                      (long)((int)uVar15 >> 0xc) * 8);
                    uVar10 = (ulong)((uVar15 & 0xfff) << 4);
                    *(ulong *)(lVar16 + uVar10) =
                         *(ulong *)(lVar16 + uVar10) & 0xffffffffc0000000 |
                         (ulong)((uint)uVar20 & 0x3fffffff);
                    uVar20 = *puVar17;
                    if ((uVar20 & 0x700000000) != 0x600000000) {
                      __assert_fail("Au_ObjIsBox(p)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                                    ,0xb5,"int Au_BoxFanoutNum(Au_Obj_t *)");
                    }
                  }
                  iVar12 = *(int *)((long)pvVar8 + 0x3c);
                  lVar16 = (long)iVar12;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < lVar16);
              uVar15 = (p->vNtks).nSize;
              lVar5 = (long)(int)uVar15;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < lVar5);
        }
        ppvVar3 = (p->vNtks).pArray;
        if (ppvVar3 != (void **)0x0) {
          free(ppvVar3);
          uVar15 = (p->vNtks).nSize;
        }
        ppvVar3 = *(void ***)(__ptr + 2);
        (p->vNtks).pArray = ppvVar3;
        free(__ptr);
        if (1 < (int)uVar15) {
          uVar20 = 1;
          do {
            if (uVar20 == uVar15) {
LAB_0085a41b:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar8 = ppvVar3[uVar20];
            lVar19 = (long)*(int *)((long)pvVar8 + 0x3c);
            if (0 < lVar19) {
              lVar5 = 0;
              do {
                if (lVar19 == lVar5) goto LAB_0085a3fc;
                uVar18 = *(uint *)(*(long *)((long)pvVar8 + 0x40) + lVar5 * 4);
                lVar16 = *(long *)(*(long *)((long)pvVar8 + 0x78) + (long)((int)uVar18 >> 0xc) * 8);
                uVar13 = (ulong)((uVar18 & 0xfff) << 4);
                uVar10 = *(ulong *)(lVar16 + uVar13);
                if ((uVar10 & 0x700000000) == 0x600000000) {
                  uVar13 = lVar16 + uVar13;
                  lVar16 = *(long *)(*(long *)(uVar13 & 0xfffffffffffffc00) + 8);
                  uVar18 = (uint)uVar10 & 0x3fffffff;
                  if (*(int *)(lVar16 + 0xc) <= (int)uVar18) goto LAB_0085a41b;
                  pvVar4 = *(void **)(*(long *)(lVar16 + 0x10) +
                                     (ulong)((uint)uVar10 & 0x3fffffff) * 8);
                  if ((pvVar4 != (void *)0x0) && (pvVar4 != pvVar8)) {
                    if (((uVar10 & 0x3fffffff) != 0) && (uVar18 < *(uint *)((long)pvVar8 + 0x10))) {
                      __assert_fail("!pBox->Func || pBox->Func >= (unsigned)pNtk->Id",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                                    ,0x1e6,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
                    }
                    if (*(uint *)((long)pvVar4 + 0x50) != (uint)(uVar10 >> 0x23)) {
                      __assert_fail("Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                                    ,0x1e7,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
                    }
                    if (*(int *)(uVar13 + 8 + (uVar10 >> 0x23) * 4) != *(int *)((long)pvVar4 + 0x54)
                       ) {
                      __assert_fail("Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                                    ,0x1e8,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
                    }
                  }
                }
                lVar5 = lVar5 + 1;
              } while (lVar19 != lVar5);
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar15);
        }
        if (pvVar7 == (void *)0x0) {
          return;
        }
        free(pvVar7);
        return;
      }
    }
  }
LAB_0085a3fc:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Au_ManReorderModels( Au_Man_t * p, Au_Ntk_t * pRoot )
{
    Vec_Ptr_t * vNtksNew;
    Vec_Int_t * vOrder, * vTemp;
    Au_Ntk_t * pNtk, * pBoxModel;
    Au_Obj_t * pBox, * pFan;
    int i, k, j, Entry;
    Au_ManForEachNtk( p, pNtk, i )
        pNtk->fMark = 0;
    // collect networks in the DFS order
    vOrder = Vec_IntAlloc( Au_ManNtkNum(p)+1 );
    Vec_IntPush( vOrder, 0 );
    Au_ManReorderModels_rec( pRoot, vOrder );
    assert( Vec_IntEntryLast(vOrder) == pRoot->Id );
    // add unconnected ones
    Vec_IntPop( vOrder );
    Au_ManForEachNtk( p, pNtk, i )
        if ( pNtk->fMark == 0 )
            Vec_IntPush( vOrder, pNtk->Id );
    Vec_IntPush( vOrder, pRoot->Id );
    assert( Vec_IntSize(vOrder) == Au_ManNtkNum(p)+1 );
    // reverse order
    vOrder->nSize--;
    vOrder->pArray++;
    Vec_IntReverseOrder( vOrder ); 
    vOrder->pArray--;
    vOrder->nSize++;
    // compute new order
    vNtksNew = Vec_PtrAlloc( Au_ManNtkNum(p)+1 );
    Vec_IntForEachEntry( vOrder, Entry, i )
        Vec_PtrPush( vNtksNew, Au_ManNtk(p, Entry) );
    // invert order
    assert( Vec_IntEntry(vOrder, 1) == pRoot->Id );
    vOrder = Vec_IntInvert( vTemp = vOrder, 0 );
    Vec_IntFree( vTemp );
    assert( Vec_IntEntry(vOrder, 1) == pRoot->Id );
    // update model numbers
    Au_ManForEachNtk( p, pNtk, i )
    {
        pNtk->Id = Vec_IntEntry( vOrder, pNtk->Id );
        Au_NtkForEachBox( pNtk, pBox, k )
        {
            pBox->Func = Vec_IntEntry( vOrder, pBox->Func );
            assert( pBox->Func > 0 );
            Au_BoxForEachFanout( pBox, pFan, j )
                pFan->Func = pBox->Func;
        }
    }
    // update
    ABC_FREE( p->vNtks.pArray );
    p->vNtks.pArray = vNtksNew->pArray;
    vNtksNew->pArray = NULL;
    Vec_PtrFree( vNtksNew );
    // verify
    Au_ManForEachNtk( p, pNtk, i )
        Au_NtkForEachBox( pNtk, pBox, k )
        {
            pBoxModel = Au_ObjModel(pBox);
            if ( pBoxModel == NULL || pBoxModel == pNtk )
                continue;
            assert( !pBox->Func || pBox->Func >= (unsigned)pNtk->Id );
            assert( Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel) );
            assert( Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel) );
        }
    Vec_IntFree( vOrder );
}